

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPuffRecord.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GaussianPuffRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GaussianPuffRecord *this)

{
  ostream *poVar1;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GaussianPuffRecord *local_18;
  GaussianPuffRecord *this_local;
  
  local_18 = this;
  this_local = (GaussianPuffRecord *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tPuff Location:        ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1f0,&this->m_PuffLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tOrigination Location: ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_210,&this->m_OrigLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\tSigma:                ");
  Vector::GetAsString_abi_cxx11_(&local_230,&this->m_Sigma);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"\td(Sigma)/dt:          ");
  Vector::GetAsString_abi_cxx11_(&local_250,&this->m_DDTSigma);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"\tOrientation:          ");
  EulerAngles::GetAsString_abi_cxx11_(&local_270,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"\tVelocity:             ");
  Vector::GetAsString_abi_cxx11_(&local_290,&this->m_Velocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,"\tAngualr Velocity:     ");
  Vector::GetAsString_abi_cxx11_(&local_2b0,&this->m_AngularVelocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  poVar1 = std::operator<<(poVar1,"\tCentroid Height:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CentHeight);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GaussianPuffRecord::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tPuff Location:        " << m_PuffLocation.GetAsString()
       << "\tOrigination Location: " << m_OrigLocation.GetAsString()
       << "\tSigma:                " << m_Sigma.GetAsString()
       << "\td(Sigma)/dt:          " << m_DDTSigma.GetAsString()
       << "\tOrientation:          " << m_Ori.GetAsString()
       << "\tVelocity:             " << m_Velocity.GetAsString()
       << "\tAngualr Velocity:     " << m_AngularVelocity.GetAsString()
       << "\tCentroid Height:      " << m_f32CentHeight << "\n";

    return ss.str();
}